

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::Array2D<pbrt::SPPMPixel>::Array2D
          (Array2D<pbrt::SPPMPixel> *this,Bounds2i *extent,allocator_type allocator)

{
  undefined8 *puVar1;
  SPPMPixel *pSVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  long lVar6;
  
  TVar3 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar3;
  (this->allocator).memoryResource = allocator.memoryResource;
  uVar5 = ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.y -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y) *
          ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.x -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x);
  iVar4 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                    (allocator.memoryResource,(long)(int)uVar5 * 0xa0,8);
  this->values = (SPPMPixel *)CONCAT44(extraout_var,iVar4);
  for (lVar6 = 0; (ulong)(~((int)uVar5 >> 0x1f) & uVar5) * 0xa0 - lVar6 != 0; lVar6 = lVar6 + 0xa0)
  {
    pSVar2 = this->values;
    puVar1 = (undefined8 *)((long)(pSVar2->vp).beta.values.values + lVar6 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1 = (undefined8 *)((long)(pSVar2->vp).beta.values.values + lVar6 + -0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1 = (undefined8 *)((long)(pSVar2->vp).beta.values.values + lVar6 + -0x68);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    SPPMPixel::SPPMPixel((SPPMPixel *)((long)(pSVar2->vp).beta.values.values + lVar6 + -0x68));
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, allocator_type allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }